

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  UnknownField *this_00;
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  pointer pUVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    pvVar4 = this->fields_;
    pUVar3 = (pvVar4->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar4->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_finish == pUVar3) {
      iVar6 = 0;
    }
    else {
      lVar8 = 0;
      uVar5 = 0;
      uVar7 = 0;
      do {
        this_00 = (UnknownField *)((long)&pUVar3->number_ + lVar8);
        if (*(int *)((long)&pUVar3->number_ + lVar8) == number) {
          UnknownField::Delete(this_00);
        }
        else {
          if (uVar5 != uVar7) {
            uVar2 = this_00->type_;
            aVar1 = this_00->data_;
            pUVar3 = pUVar3 + (int)uVar7;
            pUVar3->number_ = this_00->number_;
            pUVar3->type_ = uVar2;
            pUVar3->data_ = aVar1;
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        iVar6 = (int)uVar7;
        uVar5 = uVar5 + 1;
        pvVar4 = this->fields_;
        pUVar3 = (pvVar4->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x10;
      } while (uVar5 < (ulong)((long)(pvVar4->
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 4
                              ));
    }
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    resize(pvVar4,(long)iVar6);
    if (iVar6 == 0) {
      pvVar4 = this->fields_;
      if (pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        pUVar3 = (pvVar4->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pUVar3 != (pointer)0x0) {
          operator_delete(pUVar3,(long)(pvVar4->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pUVar3);
        }
        operator_delete(pvVar4,0x18);
      }
      this->fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  if (fields_ == NULL) return;
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_->size(); ++i) {
    UnknownField* field = &(*fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (*fields_)[left] = (*fields_)[i];
      }
      ++left;
    }
  }
  fields_->resize(left);
  if (left == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}